

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O3

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Connection::View(Connection *this,string *schema_name,string *table_name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<duckdb::Relation,_true> sVar2;
  shared_ptr<duckdb::ViewRelation,_true> local_38;
  shared_ptr<duckdb::ViewRelation> local_20;
  
  local_20.super___shared_ptr<duckdb::ViewRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ViewRelation,std::allocator<duckdb::ViewRelation>,duckdb::shared_ptr<duckdb::ClientContext,true>&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (&local_20.super___shared_ptr<duckdb::ViewRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ViewRelation **)&local_20,(allocator<duckdb::ViewRelation> *)&local_38,
             (shared_ptr<duckdb::ClientContext,_true> *)schema_name,table_name,in_RCX);
  shared_ptr<duckdb::ViewRelation,_true>::shared_ptr(&local_38,&local_20);
  _Var1._M_pi = extraout_RDX;
  if (local_20.super___shared_ptr<duckdb::ViewRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<duckdb::ViewRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_38.internal.super___shared_ptr<duckdb::ViewRelation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (this->context).internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_38.internal.super___shared_ptr<duckdb::ViewRelation,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var1._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar2.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Connection::View(const string &schema_name, const string &table_name) {
	return make_shared_ptr<ViewRelation>(context, schema_name, table_name);
}